

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O2

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
          (DependenceGraph<dg::LLVMNode> *this,Value *k)

{
  iterator iVar1;
  DGParameterPair<dg::LLVMNode> *pDVar2;
  LLVMNode *pLVar3;
  KeyT local_10;
  
  local_10 = k;
  iVar1 = std::
          _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_dg::LLVMNode_*>,_std::_Select1st<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
          ::find(&(this->nodes)._M_t,&local_10);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->nodes)._M_t._M_impl.super__Rb_tree_header) {
    if ((this->formalParameters != (DGParameters<dg::LLVMNode> *)0x0) &&
       (pDVar2 = DGParameters<dg::LLVMNode>::find(this->formalParameters,local_10),
       pDVar2 != (DGParameterPair<dg::LLVMNode> *)0x0)) {
      return pDVar2->in;
    }
    pLVar3 = _getGlobalNode<llvm::Value*>(this,local_10);
  }
  else {
    pLVar3 = (LLVMNode *)iVar1._M_node[1]._M_parent;
  }
  return pLVar3;
}

Assistant:

NodeT *_getNode(T k) {
        auto it = nodes.find(k);
        if (it != nodes.end())
            return it->second;

        if (formalParameters) {
            auto p = formalParameters->find(k);
            if (p)
                return p->in;
        }

        return getGlobalNode(k);
    }